

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O2

int Prs_CreateCatIn(Cba_Ntk_t *p,Prs_Ntk_t *pNtk,int Con)

{
  uint i;
  int iVar1;
  int iVar2;
  int iVar3;
  
  Prs_CatSignals(pNtk,Con);
  i = Cba_ObjAlloc(p,CBA_BOX_CONCAT,Prs_CatSignals::V.nSize,1);
  iVar1 = Cba_ObjFon0(p,i);
  iVar3 = 0;
  iVar2 = Cba_NtkNewStrId(p,"_icc%d_",(ulong)i);
  Cba_FonSetName(p,iVar1,iVar2);
  Cba_NtkSetMap(p,iVar2,iVar1);
  for (iVar1 = 0; iVar1 < Prs_CatSignals::V.nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(&Prs_CatSignals::V,iVar1);
    iVar2 = Prs_CreateSignalIn(p,pNtk,iVar2);
    if (iVar2 != 0) {
      Cba_ObjSetFinFon(p,i,iVar1,iVar2);
      iVar2 = Cba_FonRangeSize(p,iVar2);
      iVar3 = iVar3 + iVar2;
    }
  }
  iVar1 = Cba_ObjFon0(p,i);
  iVar2 = Cba_NtkHashRange(p,iVar3 + -1,0);
  Cba_FonSetRange(p,iVar1,iVar2);
  iVar1 = Cba_ObjFon0(p,i);
  return iVar1;
}

Assistant:

int Prs_CreateCatIn( Cba_Ntk_t * p, Prs_Ntk_t * pNtk, int Con )
{
    extern int Prs_CreateSignalIn( Cba_Ntk_t * p, Prs_Ntk_t * pNtk, int Sig );
    int i, Sig, iObj, iFon, NameId, nBits = 0;
    Vec_Int_t * vSigs = Prs_CatSignals(pNtk, Con);
    // create input concatenation
    iObj = Cba_ObjAlloc( p, CBA_BOX_CONCAT, Vec_IntSize(vSigs), 1 );
    iFon = Cba_ObjFon0(p, iObj);
    //sprintf( Buffer, "_icc%d_", iObj );
    //NameId = Cba_NtkNewStrId( p, Buffer );
    NameId = Cba_NtkNewStrId( p, "_icc%d_", iObj );
    Cba_FonSetName( p, iFon, NameId );
    Cba_NtkSetMap( p, NameId, iFon );
    // set inputs
    Vec_IntForEachEntry( vSigs, Sig, i )
    {
        iFon = Prs_CreateSignalIn( p, pNtk, Sig );
        if ( iFon )
            Cba_ObjSetFinFon( p, iObj, i, iFon );
        if ( iFon )
            nBits += Cba_FonRangeSize( p, iFon );
    }
    iFon = Cba_ObjFon0(p, iObj);
    Cba_FonSetRange( p, iFon, Cba_NtkHashRange(p, nBits-1, 0) );
    return Cba_ObjFon0(p, iObj);
}